

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cube.cpp
# Opt level: O0

Tuple4d * __thiscall
geometry::primitive::Cube::local_normal
          (Tuple4d *__return_storage_ptr__,Cube *this,Tuple4d *point,Intersection *hit)

{
  double dVar1;
  double *pdVar2;
  Tuple4d *pTVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  undefined4 local_38;
  undefined4 local_34;
  int i_1;
  int i;
  double max;
  Intersection *hit_local;
  Tuple4d *point_local;
  Cube *this_local;
  Tuple4d *ret;
  
  _i_1 = 0.0;
  for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
    pTVar3 = point;
    math::Tuple4d::operator()(point,(long)local_34);
    std::abs((int)pTVar3);
    if (_i_1 < extraout_XMM0_Qa) {
      pTVar3 = point;
      math::Tuple4d::operator()(point,(long)local_34);
      std::abs((int)pTVar3);
      _i_1 = extraout_XMM0_Qa_00;
    }
  }
  math::vector(__return_storage_ptr__,0.0,0.0,0.0);
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    pTVar3 = point;
    math::Tuple4d::operator()(point,(long)local_38);
    std::abs((int)pTVar3);
    if ((_i_1 == extraout_XMM0_Qa_01) && (!NAN(_i_1) && !NAN(extraout_XMM0_Qa_01))) {
      pdVar2 = math::Tuple4d::operator()(point,(long)local_38);
      dVar1 = *pdVar2;
      pdVar2 = math::Tuple4d::operator()(__return_storage_ptr__,(long)local_38);
      *pdVar2 = dVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

math::Tuple4d geometry::primitive::Cube::local_normal(const math::Tuple4d &point, const core::Intersection &hit) const
{
    double max = 0;
    for (int i = 0; i < 3; i++)
    {
	if (std::abs(point(i)) > max)
	    max = std::abs(point(i));
    }

    math::Tuple4d ret = math::vector(0, 0, 0);
    for (int i = 0; i < 3; i++)
    {
	if (max == std::abs(point(i)))
	    ret(i) = point(i);
    }
    return ret;
}